

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O0

JavascriptString * Js::JavascriptNumber::ToStringRadix10(double value,ScriptContext *scriptContext)

{
  BOOL BVar1;
  OLECHAR local_a28 [4];
  char16 szBuffer [1280];
  JavascriptString *string;
  ScriptContext *scriptContext_local;
  double value_local;
  
  szBuffer._2552_8_ = ToStringNanOrInfiniteOrZero(value,scriptContext);
  value_local = (double)szBuffer._2552_8_;
  if ((JavascriptString *)szBuffer._2552_8_ == (JavascriptString *)0x0) {
    szBuffer._2552_8_ = ScriptContext::GetLastNumberToStringRadix10(scriptContext,value);
    if ((JavascriptString *)szBuffer._2552_8_ == (JavascriptString *)0x0) {
      BVar1 = NumberUtilities::FNonZeroFiniteDblToStr(value,local_a28,0x500);
      if (BVar1 == 0) {
        JavascriptError::ThrowOutOfMemoryError(scriptContext);
      }
      szBuffer._2552_8_ = JavascriptString::NewCopySz(local_a28,scriptContext);
      ScriptContext::SetLastNumberToStringRadix10
                (scriptContext,value,(JavascriptString *)szBuffer._2552_8_);
    }
    value_local = (double)szBuffer._2552_8_;
  }
  return (JavascriptString *)value_local;
}

Assistant:

JavascriptString* JavascriptNumber::ToStringRadix10(double value, ScriptContext* scriptContext)
    {
        JavascriptString* string = ToStringNanOrInfiniteOrZero(value, scriptContext);
        if (string != nullptr)
        {
            return string;
        }

        string = scriptContext->GetLastNumberToStringRadix10(value);
        if (string == nullptr)
        {
            char16 szBuffer[bufSize];

            if(!Js::NumberUtilities::FNonZeroFiniteDblToStr(value, szBuffer, bufSize))
            {
                Js::JavascriptError::ThrowOutOfMemoryError(scriptContext);
            }
            string = JavascriptString::NewCopySz(szBuffer, scriptContext);
            scriptContext->SetLastNumberToStringRadix10(value, string);
        }
        return string;
    }